

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unbuf.cc
# Opt level: O1

void __thiscall bsplib::Unbuf::~Unbuf(Unbuf *this)

{
  pointer piVar1;
  pointer ppoVar2;
  pointer pEVar3;
  
  MPI_Comm_free(&this->m_comm);
  this->m_comm = (MPI_Comm)&ompi_mpi_comm_null;
  piVar1 = (this->m_ready).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->m_ready).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar1);
  }
  ppoVar2 = (this->m_reqs).super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppoVar2 != (pointer)0x0) {
    operator_delete(ppoVar2,(long)(this->m_reqs).
                                  super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppoVar2
                   );
  }
  pEVar3 = (this->m_recvs).
           super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pEVar3 != (pointer)0x0) {
    operator_delete(pEVar3,(long)(this->m_recvs).
                                 super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pEVar3);
  }
  pEVar3 = (this->m_sends).
           super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pEVar3 != (pointer)0x0) {
    operator_delete(pEVar3,(long)(this->m_sends).
                                 super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pEVar3);
    return;
  }
  return;
}

Assistant:

Unbuf::~Unbuf() {
    MPI_Comm_free( &m_comm );
    m_comm = MPI_COMM_NULL;
}